

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O2

int * GetGenericProperty<int>
                (map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *list,char *szName,int *errorReturn)

{
  const_iterator cVar1;
  int *piVar2;
  uint32_t hash;
  
  if (szName != (char *)0x0) {
    SuperFastHash(szName,0,0);
    cVar1 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
            ::find(&list->_M_t,&hash);
    piVar2 = (int *)&cVar1._M_node[1].field_0x4;
    if ((_Rb_tree_header *)cVar1._M_node == &(list->_M_t)._M_impl.super__Rb_tree_header) {
      piVar2 = errorReturn;
    }
    return piVar2;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/GenericProperty.h"
                ,0x50,
                "const T &GetGenericProperty(const std::map<unsigned int, T> &, const char *, const T &) [T = int]"
               );
}

Assistant:

inline
const T& GetGenericProperty(const std::map< unsigned int, T >& list,
        const char* szName, const T& errorReturn) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::const_iterator it = list.find(hash);
    if (it == list.end()) {
        return errorReturn;
    }

    return (*it).second;
}